

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

bool __thiscall
iDynTree::InverseKinematics::setCOMConstraintProjectionDirection
          (InverseKinematics *this,Span<const_double,__1L> direction)

{
  char *pcVar1;
  char *pcVar2;
  
  if (direction.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "setCOMConstraintProjectionDirection";
    pcVar1 = "Wrong size in input direction";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::setCOMConstraintProjectionDirection(iDynTree::Span<const double> direction)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (direction.size() == expected_pos_size);
        if( !ok )
        {
            reportError("InverseKinematics",
                        "setCOMConstraintProjectionDirection",
                        "Wrong size in input direction");
            return false;
        }

#ifdef IDYNTREE_USES_IPOPT
        // define the projection matrix 'Pdirection' in the class 'ConvexHullProjectionConstraint'
        IK_PIMPL(m_pimpl)->m_comHullConstraint_projDirection = direction;
        IK_PIMPL(m_pimpl)->m_comHullConstraint.setProjectionAlongDirection(direction);

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }